

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

char * __thiscall CaDiCaL::Parser::parse_lit(Parser *this,int *ch,int *lit,int *vars,int strict)

{
  uint uVar1;
  int iVar2;
  Internal *pIVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *unaff_R12;
  
  iVar5 = *ch;
  if (iVar5 == 0x61) {
    unaff_R12 = "unexpected \'a\' in CNF";
  }
  else {
    if (iVar5 == 0x2d) {
      iVar5 = File::get(this->file);
      *ch = iVar5;
      iVar6 = -1;
      if (9 < iVar5 - 0x30U) {
        Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
        pIVar3 = this->internal;
        pcVar7 = "expected digit after \'-\'";
LAB_00850f6d:
        pcVar7 = Format::append(&pIVar3->error_message,pcVar7);
        return pcVar7;
      }
    }
    else {
      iVar6 = 1;
      if (9 < iVar5 - 0x30U) {
        Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
        pIVar3 = this->internal;
        pcVar7 = "expected digit or \'-\'";
        goto LAB_00850f6d;
      }
    }
    *lit = *ch + -0x30;
    do {
      iVar5 = File::get(this->file);
      *ch = iVar5;
      if (9 < iVar5 - 0x30U) {
        if (iVar5 == 0xd) {
          iVar5 = File::get(this->file);
          *ch = iVar5;
        }
        uVar1 = *ch + 1;
        if (((0x21 < uVar1) || ((0x200000c01U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) && (*ch != 99)) {
          Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
          pcVar7 = Format::append(&this->internal->error_message,"expected white space after \'%d\'"
                                  ,(ulong)(uint)(iVar6 * *lit));
          return pcVar7;
        }
        if (*vars < *lit) {
          if (strict != 0) {
            Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
            pcVar7 = Format::append(&this->internal->error_message,
                                    "literal %d exceeds maximum variable %d",
                                    (ulong)(uint)(iVar6 * *lit),(ulong)(uint)*vars);
            return pcVar7;
          }
          *vars = *lit;
        }
        *lit = iVar6 * *lit;
        return (char *)0x0;
      }
      iVar2 = *lit;
      if ((iVar2 < 0xccccccd) &&
         (SBORROW4(-0x7fffffd1 - iVar5,iVar2 * 10) == (-0x7fffffd1 - iVar5) + iVar2 * -10 < 0)) {
        *lit = iVar2 * 10 + (iVar5 - 0x30U);
        bVar4 = true;
      }
      else {
        bVar4 = false;
        Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
        unaff_R12 = Format::append(&this->internal->error_message,"literal too large");
      }
    } while (bVar4);
  }
  return unaff_R12;
}

Assistant:

inline const char *Parser::parse_lit (int &ch, int &lit, int &vars,
                                      int strict) {
  if (ch == 'a')
    return cube_token;
  int sign = 0;
  if (ch == '-') {
    if (!isdigit (ch = parse_char ()))
      PER ("expected digit after '-'");
    sign = -1;
  } else if (!isdigit (ch))
    PER ("expected digit or '-'");
  else
    sign = 1;
  lit = ch - '0';
  while (isdigit (ch = parse_char ())) {
    int digit = ch - '0';
    if (INT_MAX / 10 < lit || INT_MAX - digit < 10 * lit)
      PER ("literal too large");
    lit = 10 * lit + digit;
  }
  if (ch == '\r')
    ch = parse_char ();
  if (ch != 'c' && ch != ' ' && ch != '\t' && ch != '\n' && ch != EOF)
    PER ("expected white space after '%d'", sign * lit);
  if (lit > vars) {
    if (strict != FORCED)
      PER ("literal %d exceeds maximum variable %d", sign * lit, vars);
    else
      vars = lit;
  }
  lit *= sign;
  return 0;
}